

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# application.cpp
# Opt level: O1

int __thiscall application::run(application *this,int argc,char **argv)

{
  pointer pbVar1;
  char *pcVar2;
  typed_value<unsigned_short,_char> *ptVar3;
  const_iterator cVar4;
  cab_server *this_00;
  pointer __p;
  uint16_t port;
  options_description options;
  variables_map variables;
  unsigned_short local_1ca;
  undefined1 local_1c8 [32];
  _Alloc_hider local_1a8;
  size_type local_1a0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_198;
  error_code local_188;
  long *local_178 [2];
  long local_168 [3];
  vector<boost::shared_ptr<boost::program_options::option_description>,_std::allocator<boost::shared_ptr<boost::program_options::option_description>_>_>
  local_150 [24];
  void *local_138;
  undefined4 local_130;
  undefined8 local_128;
  undefined4 local_120;
  long local_118;
  vector<boost::shared_ptr<boost::program_options::options_description>,_std::allocator<boost::shared_ptr<boost::program_options::options_description>_>_>
  local_110 [24];
  long *local_f8 [2];
  long local_e8;
  _Rb_tree_node_base local_e0;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_b8 [48];
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_88;
  function1<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
  local_58;
  
  local_1ca = 0;
  local_f8[0] = &local_e8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_f8,"Options","");
  boost::program_options::options_description::options_description
            ((options_description *)local_178,(string *)local_f8,
             (uint)boost::program_options::options_description::m_default_line_length,
             (uint)boost::program_options::options_description::m_default_line_length >> 1);
  if (local_f8[0] != &local_e8) {
    operator_delete(local_f8[0],local_e8 + 1);
  }
  local_f8[0] = (long *)boost::program_options::options_description::add_options();
  pcVar2 = (char *)boost::program_options::options_description_easy_init::operator()
                             ((char *)local_f8,"help");
  ptVar3 = boost::program_options::value<unsigned_short>(&local_1ca);
  local_1c8._0_2_ = 0x2694;
  ptVar3 = boost::program_options::typed_value<unsigned_short,_char>::default_value
                     (ptVar3,(unsigned_short *)local_1c8);
  boost::program_options::options_description_easy_init::operator()
            (pcVar2,(value_semantic *)0x122444,(char *)ptVar3);
  boost::program_options::variables_map::variables_map((variables_map *)local_f8);
  local_58.super_function_base.vtable = (vtable_base *)0x0;
  local_58.super_function_base.functor.members.obj_ptr = (obj_ptr_t)0x0;
  local_58.super_function_base.functor._8_8_ = 0;
  local_58.super_function_base.functor._16_8_ = 0;
  boost::program_options::parse_command_line<char>
            ((basic_parsed_options<char> *)local_1c8,argc,argv,(options_description *)local_178,0,
             &local_58);
  boost::program_options::store((basic_parsed_options *)local_1c8,(variables_map *)local_f8,false);
  std::
  vector<boost::program_options::basic_option<char>,_std::allocator<boost::program_options::basic_option<char>_>_>
  ::~vector((vector<boost::program_options::basic_option<char>,_std::allocator<boost::program_options::basic_option<char>_>_>
             *)local_1c8);
  boost::
  function1<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
  ::~function1(&local_58);
  boost::program_options::notify((variables_map *)local_f8);
  local_1c8._0_8_ = (pointer)(local_1c8 + 0x10);
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1c8,"help","");
  cVar4 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
          ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
                  *)&local_e8,(key_type *)local_1c8);
  if ((pointer)local_1c8._0_8_ != (pointer)(local_1c8 + 0x10)) {
    operator_delete((void *)local_1c8._0_8_,(ulong)(local_1c8._16_8_ + 1));
  }
  if (cVar4._M_node == &local_e0) {
    this_00 = (cab_server *)operator_new(0x60);
    cab_server::cab_server(this_00,this,&this->_io_service,local_1ca);
    local_1c8._0_8_ = (pointer)0x0;
    std::__uniq_ptr_impl<cab_server,_std::default_delete<cab_server>_>::reset
              ((__uniq_ptr_impl<cab_server,_std::default_delete<cab_server>_> *)&this->_cab_server,
               this_00);
    std::unique_ptr<cab_server,_std::default_delete<cab_server>_>::~unique_ptr
              ((unique_ptr<cab_server,_std::default_delete<cab_server>_> *)local_1c8);
    cab_server::run((this->_cab_server)._M_t.
                    super___uniq_ptr_impl<cab_server,_std::default_delete<cab_server>_>._M_t.
                    super__Tuple_impl<0UL,_cab_server_*,_std::default_delete<cab_server>_>.
                    super__Head_base<0UL,_cab_server_*,_false>._M_head_impl);
    local_188.val_ = 0;
    local_188._4_4_ = local_188._4_4_ & 0xffffff00;
    local_188.cat_ =
         &boost::system::detail::cat_holder<void>::system_category_instance.super_error_category;
    boost::asio::detail::scheduler::run((this->_io_service).impl_,&local_188);
    local_1c8._24_8_ = local_188.cat_;
    if (local_188.failed_ == true) {
      pbVar1 = (pointer)CONCAT44(local_188._4_4_,local_188.val_);
      std::runtime_error::runtime_error((runtime_error *)local_1c8,"");
      local_1a8._M_p = (pointer)&local_198;
      local_1c8._0_8_ = &PTR__system_error_0012fa28;
      local_1a0 = 0;
      local_198._M_local_buf[0] = '\0';
      local_1c8._16_8_ = pbVar1;
      boost::throw_exception<boost::system::system_error>((system_error *)local_1c8);
    }
  }
  else {
    boost::program_options::operator<<((ostream *)&std::cout,(options_description *)local_178);
  }
  local_f8[0] = (long *)&std::length_error::typeinfo;
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~_Rb_tree(&local_88);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~_Rb_tree(local_b8);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
  ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
               *)&local_e8);
  std::
  vector<boost::shared_ptr<boost::program_options::options_description>,_std::allocator<boost::shared_ptr<boost::program_options::options_description>_>_>
  ::~vector(local_110);
  if (local_138 != (void *)0x0) {
    operator_delete(local_138,local_118 - (long)local_138);
    local_138 = (void *)0x0;
    local_130 = 0;
    local_128 = 0;
    local_120 = 0;
    local_118 = 0;
  }
  std::
  vector<boost::shared_ptr<boost::program_options::option_description>,_std::allocator<boost::shared_ptr<boost::program_options::option_description>_>_>
  ::~vector((vector<boost::shared_ptr<boost::program_options::option_description>,_std::allocator<boost::shared_ptr<boost::program_options::option_description>_>_>
             *)(local_168 + 3));
  if (local_178[0] != local_168) {
    operator_delete(local_178[0],local_168[0] + 1);
  }
  return 0;
}

Assistant:

int application::run(int argc, char** argv)
{
    std::uint16_t port = 0;

    boost::program_options::options_description options("Options");
    options.add_options()
        ("help", "shows this message")
        ("port", boost::program_options::value<std::uint16_t>(&port)->default_value(9876), "sets the cab server port");

    boost::program_options::variables_map variables;
    boost::program_options::store(boost::program_options::parse_command_line(argc, argv, options), variables);
    boost::program_options::notify(variables);

    if(variables.count("help"))
    {
        std::cout << options;
        return 0;
    }

    _cab_server = std::make_unique<cab_server>(*this, _io_service, port);

    _cab_server->run();
    _io_service.run();

    return 0;
}